

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256.cpp
# Opt level: O2

void duckdb::Node256::InsertChild(ART *art,Node *node,uint8_t byte,Node child)

{
  Node256 *pNVar1;
  undefined7 in_register_00000011;
  
  pNVar1 = Node::Ref<duckdb::Node256>(art,(Node)(node->super_IndexPointer).data,NODE_256);
  pNVar1->count = pNVar1->count + 1;
  pNVar1->children[CONCAT71(in_register_00000011,byte) & 0xffffffff].super_IndexPointer.data =
       (idx_t)child.super_IndexPointer.data;
  return;
}

Assistant:

void Node256::InsertChild(ART &art, Node &node, const uint8_t byte, const Node child) {
	auto &n256 = Node::Ref<Node256>(art, node, NODE_256);
	n256.count++;
	n256.children[byte] = child;
}